

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _List_node_base **pp_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  const_iterator cVar4;
  int completeSubgraphs;
  ActionTest actionTest;
  DynamicGraphTest graphTest;
  variables_map args;
  PathCompleteGraphsBenchmark local_288;
  DynamicGraphTest local_190;
  code *local_c8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_b8 [8];
  _Rb_tree_node_base local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  parseArguments((int)local_c8,(char **)(ulong)(uint)argc);
  pp_Var1 = (_List_node_base **)
            ((long)&local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges + 8);
  local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"test","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_b8,(key_type *)&local_288);
  if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
    operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                    (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                    m_edges.
                                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if (cVar4._M_node != &local_b0) {
    ActionTest::ActionTest((ActionTest *)&local_288);
    DynamicGraphTest::DynamicGraphTest(&local_190);
    ActionTest::run((ActionTest *)&local_288);
    DynamicGraphTest::run(&local_190);
    local_190.super_Test._vptr_Test = (_func_int **)&PTR_run_00120bd8;
    std::vector<Relatives,_std::allocator<Relatives>_>::~vector(&local_190.G.relatives);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::~_Rb_tree(&local_190.G.virtualEdges._M_t);
    if (local_190.G.level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.G.level.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.G.level.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.G.level.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_190.G.components.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.G.components.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.G.components.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.G.components.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    operator_delete(local_190.G.super_UndirectedGraph.m_property.px,1);
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::~vector(&local_190.G.super_UndirectedGraph.super_type.m_vertices);
    while ((DynamicGraph *)
           local_190.G.super_UndirectedGraph.super_type.m_edges.
           super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
           ._M_impl._M_node.super__List_node_base._M_next != &local_190.G) {
      p_Var2 = (local_190.G.super_UndirectedGraph.super_type.m_edges.
                super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_190.G.super_UndirectedGraph.super_type.m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0x28);
      local_190.G.super_UndirectedGraph.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
    }
    ActionTest::~ActionTest((ActionTest *)&local_288);
  }
  local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"benchmark","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_b8,(key_type *)&local_288);
  if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
    operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                    (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                    m_edges.
                                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if (cVar4._M_node != &local_b0) {
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"path","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_b8,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar4._M_node != &local_b0) {
      PathBenchmark::PathBenchmark((PathBenchmark *)&local_288,vertices);
      PathBenchmark::run((PathBenchmark *)&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      std::vector<Relatives,_std::allocator<Relatives>_>::~vector
                (&local_288.super_Benchmark.G.relatives);
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::~_Rb_tree(&local_288.super_Benchmark.G.virtualEdges._M_t);
      if (local_288.super_Benchmark.G.level.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super_Benchmark.G.level.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super_Benchmark.G.level.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super_Benchmark.G.level.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288.super_Benchmark.G.components.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super_Benchmark.G.components.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super_Benchmark.G.components.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super_Benchmark.G.components.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_288.super_Benchmark.G.super_UndirectedGraph.m_property.px,1);
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_vertices);
      p_Var2 = local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      while ((DynamicGraph *)p_Var2 != &local_288.super_Benchmark.G) {
        p_Var3 = p_Var2->_M_next;
        operator_delete(p_Var2,0x28);
        p_Var2 = p_Var3;
      }
    }
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"tree","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_b8,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar4._M_node != &local_b0) {
      TreeBenchmark::TreeBenchmark((TreeBenchmark *)&local_288,vertices);
      TreeBenchmark::run((TreeBenchmark *)&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      std::vector<Relatives,_std::allocator<Relatives>_>::~vector
                (&local_288.super_Benchmark.G.relatives);
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::~_Rb_tree(&local_288.super_Benchmark.G.virtualEdges._M_t);
      if (local_288.super_Benchmark.G.level.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super_Benchmark.G.level.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super_Benchmark.G.level.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super_Benchmark.G.level.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288.super_Benchmark.G.components.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super_Benchmark.G.components.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super_Benchmark.G.components.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super_Benchmark.G.components.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_288.super_Benchmark.G.super_UndirectedGraph.m_property.px,1);
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_vertices);
      p_Var2 = local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      while ((DynamicGraph *)p_Var2 != &local_288.super_Benchmark.G) {
        p_Var3 = p_Var2->_M_next;
        operator_delete(p_Var2,0x28);
        p_Var2 = p_Var3;
      }
    }
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"random","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_b8,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar4._M_node != &local_b0) {
      RandomGraphBenchmark::RandomGraphBenchmark((RandomGraphBenchmark *)&local_288,vertices,edges);
      RandomGraphBenchmark::run((RandomGraphBenchmark *)&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      std::vector<Relatives,_std::allocator<Relatives>_>::~vector
                (&local_288.super_Benchmark.G.relatives);
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::~_Rb_tree(&local_288.super_Benchmark.G.virtualEdges._M_t);
      if (local_288.super_Benchmark.G.level.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super_Benchmark.G.level.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super_Benchmark.G.level.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super_Benchmark.G.level.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288.super_Benchmark.G.components.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super_Benchmark.G.components.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super_Benchmark.G.components.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super_Benchmark.G.components.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_288.super_Benchmark.G.super_UndirectedGraph.m_property.px,1);
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_vertices);
      while ((DynamicGraph *)
             local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges.
             super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
             ._M_impl._M_node.super__List_node_base._M_next != &local_288.super_Benchmark.G) {
        p_Var2 = (local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
        operator_delete(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,0x28);
        local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges.
        super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
      }
    }
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"path-complete","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_b8,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar4._M_node != &local_b0) {
      completeSubgraphs =
           (int)SQRT(((double)CONCAT44(0x45300000,(int)(vertices >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)vertices) - 4503599627370496.0));
      PathCompleteGraphsBenchmark::PathCompleteGraphsBenchmark
                (&local_288,completeSubgraphs,completeSubgraphs);
      PathCompleteGraphsBenchmark::run(&local_288,deletions,queries);
      PathCompleteGraphsBenchmark::~PathCompleteGraphsBenchmark(&local_288);
    }
  }
  local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"example","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_b8,(key_type *)&local_288);
  if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
    operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                    (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                    m_edges.
                                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if (cVar4._M_node != &local_b0) {
    runExample();
  }
  local_c8[0] = std::ofstream::ofstream;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_b8);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    boost::program_options::variables_map args = parseArguments(argc, argv);

    if (args.count("test")) {
        ActionTest actionTest;
        DynamicGraphTest graphTest;
        actionTest.run();
        graphTest.run();
    }
    if (args.count("benchmark")) {
        if (args.count("path")) {
            PathBenchmark pathBenchmark(vertices);
            pathBenchmark.run(deletions, queries);
        }
        if (args.count("tree")) {
            TreeBenchmark treeBenchmark(vertices);
            treeBenchmark.run(deletions, queries);
        }
        if (args.count("random")) {
            RandomGraphBenchmark randomGraphBenchmark(vertices, edges);
            randomGraphBenchmark.run(deletions, queries);
        }
        if (args.count("path-complete")) {
            PathCompleteGraphsBenchmark pathCompleteGraphsBenchmark(
                    static_cast<int>(sqrt(vertices)),
                    static_cast<int>(sqrt(vertices)));
            pathCompleteGraphsBenchmark.run(deletions, queries);
        }
    }
    if (args.count("example")) {
        runExample();
    }

    return 0;
}